

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                  *params,string *argumentType,string *argumentName)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  pointer pPVar3;
  __type_conflict _Var4;
  bool bVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  TypeInfo *this_00;
  VulkanHppGenerator *pVVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pPVar9;
  string *psVar10;
  _Base_ptr p_Var11;
  string *arguments;
  string argument;
  allocator<char> local_149;
  string *local_148;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *local_140;
  VulkanHppGenerator *local_138;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  TypeInfo *local_c8;
  _Base_ptr local_c0;
  VulkanHppGenerator *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_148 = __return_storage_ptr__;
  local_140 = handle;
  local_130 = params;
  std::operator+(&local_128,"*reinterpret_cast<",argumentType);
  std::operator+(&local_108,&local_128," *>( &");
  std::operator+(&local_90.first,&local_108,argumentName);
  std::operator+(local_148,&local_90.first," )");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  if ((_Rb_tree_header *)(local_140->second).destructorIt._M_node !=
      &(this->m_commands)._M_t._M_impl.super__Rb_tree_header) {
    getParentTypeAndName(&local_90,this,local_140);
    std::operator+(&local_108,"Vk",&local_90.first);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_90.first,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    p_Var1 = (local_140->second).destructorIt._M_node;
    this_00 = (TypeInfo *)p_Var1[5]._M_parent;
    local_c8 = (TypeInfo *)p_Var1[5]._M_left;
    local_b8 = (VulkanHppGenerator *)&this->m_structs;
    local_c0 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_138 = this;
LAB_00151da0:
    if (this_00 != local_c8) {
      psVar10 = &this_00->type;
      _Var4 = std::operator==(psVar10,&local_90.first);
      if ((!_Var4) && (_Var4 = std::operator==(psVar10,&local_140->first), !_Var4)) {
        p_Var1 = (local_140->second).destructorIt._M_node;
        p_Var11 = p_Var1[5]._M_parent;
        p_Var2 = p_Var1[5]._M_left;
        do {
          if (p_Var11 == p_Var2) {
            pPVar9 = (local_130->
                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pPVar3 = (local_130->
                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_00151e2d;
          }
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p_Var11[4]._M_right,&this_00[1].prefix);
          p_Var11 = (_Base_ptr)&p_Var11[8]._M_parent;
        } while (!_Var4);
      }
      goto LAB_001520ea;
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_90);
  }
  return local_148;
LAB_00151e2d:
  if (pPVar9 != pPVar3) goto code_r0x00151e36;
  pPVar9 = (local_130->
           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (local_130->
           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pPVar9 == pPVar3) {
      __assert_fail("found",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x28e5,
                    "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                   );
    }
    pVVar8 = local_b8;
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                    *)local_b8,&(pPVar9->type).type);
    if ((cVar6._M_node != local_c0) &&
       (cVar7 = findStructMemberItByType
                          (pVVar8,psVar10,
                           (vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                            *)&cVar6._M_node[3]._M_right),
       cVar7._M_current != *(MemberData **)(cVar6._M_node + 4))) break;
    pPVar9 = pPVar9 + 1;
  }
  bVar5 = TypeInfo::isValue(&pPVar9->type);
  if (bVar5) {
    __assert_fail("!param.type.isValue()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x28da,
                  "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                 );
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"p",&local_149);
  stripPrefix(&local_e8,&pPVar9->name,&local_50);
  anon_unknown.dwarf_dd40c::startLowerCase(&local_b0,&local_e8);
  pVVar8 = local_138;
  std::operator+(&local_128,&local_b0,".");
  std::operator+(&local_108,&local_128,&(cVar7._M_current)->name);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_50);
  psVar10 = &((cVar7._M_current)->type).type;
  bVar5 = isHandleType(pVVar8,psVar10);
  __rhs = &local_108;
  if (bVar5) {
    std::operator+(&local_50,"static_cast<",psVar10);
    std::operator+(&local_e8,&local_50,">( ");
    std::operator+(&local_b0,&local_e8,__rhs);
    std::operator+(&local_128,&local_b0," )");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__rhs,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator+(&local_128,", ",__rhs);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (local_148,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  goto LAB_001520bf;
code_r0x00151e36:
  _Var4 = std::operator==(&(pPVar9->type).type,psVar10);
  pPVar9 = pPVar9 + 1;
  if (_Var4) goto LAB_00151e4d;
  goto LAB_00151e2d;
LAB_00151e4d:
  bVar5 = isHandleType(local_138,psVar10);
  if (bVar5) {
    bVar5 = TypeInfo::isValue(this_00);
    if (!bVar5) {
      __assert_fail("destructorParam.type.isValue()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x28c1,
                    "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                   );
    }
    std::operator+(&local_e8,", static_cast<",psVar10);
    std::operator+(&local_b0,&local_e8,">( *");
    std::operator+(&local_128,&local_b0,&this_00[1].prefix);
    std::operator+(&local_108,&local_128," )");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (local_148,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_b0);
    __rhs = &local_e8;
LAB_001520bf:
    std::__cxx11::string::~string((string *)__rhs);
  }
  else {
    bVar5 = std::operator==(psVar10,"VkAllocationCallbacks");
    if (!bVar5) {
      __assert_fail("destructorParam.type.type == \"VkAllocationCallbacks\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x28c6,
                    "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (local_148,", allocator");
  }
LAB_001520ea:
  this_00 = (TypeInfo *)&this_00[2].postfix._M_string_length;
  goto LAB_00151da0;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments( std::pair<std::string, HandleData> const & handle,
                                                                                std::vector<ParamData> const &             params,
                                                                                std::string const &                        argumentType,
                                                                                std::string const &                        argumentName ) const
{
  std::string arguments = "*reinterpret_cast<" + argumentType + " *>( &" + argumentName + " )";
  if ( handle.second.destructorIt != m_commands.end() )
  {
    auto [parentType, parentName] = getParentTypeAndName( handle );
    parentType                    = "Vk" + parentType;
    for ( auto const & destructorParam : handle.second.destructorIt->second.params )
    {
      if ( ( destructorParam.type.type != parentType ) && ( destructorParam.type.type != handle.first ) &&
           std::ranges::none_of( handle.second.destructorIt->second.params,
                                 [&destructorParam]( ParamData const & pd ) { return pd.lenExpression == destructorParam.name; } ) )
      {
        if ( std::ranges::any_of( params, [&destructorParam]( ParamData const & pd ) { return pd.type.type == destructorParam.type.type; } ) )
        {
          if ( isHandleType( destructorParam.type.type ) )
          {
            assert( destructorParam.type.isValue() );
            arguments += ", static_cast<" + destructorParam.type.type + ">( *" + destructorParam.name + " )";
          }
          else
          {
            assert( destructorParam.type.type == "VkAllocationCallbacks" );
            arguments += ", allocator";
          }
        }
        else
        {
#if !defined( NDEBUG )
          bool found = false;
#endif
          for ( auto const & param : params )
          {
            auto structureIt = m_structs.find( param.type.type );
            if ( structureIt != m_structs.end() )
            {
              auto memberIt = findStructMemberItByType( destructorParam.type.type, structureIt->second.members );
              if ( memberIt != structureIt->second.members.end() )
              {
#if !defined( NDEBUG )
                found = true;
#endif
                assert( !param.type.isValue() );
                std::string argument = startLowerCase( stripPrefix( param.name, "p" ) ) + "." + memberIt->name;
                if ( isHandleType( memberIt->type.type ) )
                {
                  argument = "static_cast<" + memberIt->type.type + ">( " + argument + " )";
                }
                arguments += ", " + argument;
                break;
              }
            }
          }
          assert( found );
        }
      }
    }
  }
  return arguments;
}